

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O1

bool __thiscall trieste::detail::Make::try_pop(Make *this,Token *type)

{
  element_type *peVar1;
  TokenDef *pTVar2;
  TokenDef *pTVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  peVar1 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pTVar2 = (peVar1->type_).def;
  pTVar3 = type->def;
  if (pTVar2 == pTVar3) {
    psVar4 = (peVar1->children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((peVar1->children).
        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar4) {
      Location::operator*=
                (&peVar1->location_,
                 &(psVar4[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->location_);
    }
    std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<trieste::NodeDef,void>
              ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
               ((this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->parent_);
    p_Var5 = p_Stack_30;
    peVar1 = local_38;
    local_38 = (element_type *)0x0;
    p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (this->node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var5;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    }
  }
  return pTVar2 == pTVar3;
}

Assistant:

bool try_pop(const Token& type)
      {
        if (in(type))
        {
          extend();

          node = node->parent()->shared_from_this();
          return true;
        }

        return false;
      }